

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix __thiscall maths::Matrix::transpose(Matrix *this)

{
  int iVar1;
  uint uVar2;
  double **ppdVar3;
  double *pdVar4;
  double **extraout_RDX;
  double **ppdVar5;
  int *in_RSI;
  long lVar6;
  ulong uVar7;
  Matrix MVar8;
  
  Matrix(this,in_RSI[1],*in_RSI);
  iVar1 = *in_RSI;
  ppdVar5 = extraout_RDX;
  if (0 < (long)iVar1) {
    uVar2 = in_RSI[1];
    ppdVar5 = *(double ***)(in_RSI + 2);
    ppdVar3 = this->p;
    lVar6 = 0;
    do {
      if (0 < (int)uVar2) {
        pdVar4 = ppdVar5[lVar6];
        uVar7 = 0;
        do {
          ppdVar3[uVar7][lVar6] = pdVar4[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  MVar8.p = ppdVar5;
  MVar8._0_8_ = this;
  return MVar8;
}

Assistant:

Matrix Matrix::transpose()
{
    Matrix ret(cols_, rows_);
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            ret.p[j][i] = p[i][j];
        }
    }
    return ret;
}